

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rk_function.hpp
# Opt level: O1

vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
* __thiscall
cvs_rk::rk_function<9223372036854775783UL>::to_mod_vector
          (vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
           *__return_storage_ptr__,rk_function<9223372036854775783UL> *this,string *S)

{
  size_type sVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ulong uVar8;
  ulong uVar9;
  size_type sVar10;
  allocator_type local_51;
  vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  *local_50;
  pointer local_48;
  pointer local_40;
  rk_function<9223372036854775783UL> *local_38;
  
  local_50 = __return_storage_ptr__;
  local_38 = this;
  std::
  vector<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
  ::vector(__return_storage_ptr__,S->_M_string_length,&local_51);
  sVar1 = S->_M_string_length;
  if (sVar1 != 0) {
    local_40 = (S->_M_dataplus)._M_p;
    local_48 = (local_50->
               super__Vector_base<cvs_rk::mod_int<9223372036854775783UL>,_std::allocator<cvs_rk::mod_int<9223372036854775783UL>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    uVar9 = 1;
    sVar10 = 0;
    do {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (ulong)(long)local_40[sVar10] % 0x7fffffffffffffe7;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar9;
      uVar8 = __umodti3(SUB168(auVar2 * auVar6,0),SUB168(auVar2 * auVar6,8),0x7fffffffffffffe7,0);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar8;
      local_48[sVar10].val =
           uVar8 + (SUB168(auVar3 * ZEXT816(0x400000000000000d),8) >> 0x3d) * -0x7fffffffffffffe7;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = (local_38->sigma).val % 0x7fffffffffffffe7;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = uVar9;
      uVar9 = __umodti3(SUB168(auVar4 * auVar7,0),SUB168(auVar4 * auVar7,8),0x7fffffffffffffe7,0);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar9;
      uVar9 = uVar9 + (SUB168(auVar5 * ZEXT816(0x400000000000000d),8) >> 0x3d) * -0x7fffffffffffffe7
      ;
      sVar10 = sVar10 + 1;
    } while (sVar1 != sVar10);
  }
  return local_50;
}

Assistant:

vector<mod_int_t> to_mod_vector(string& S){

		mod_int_t coefficient = 1;

		auto result = vector<mod_int_t>(S.length());
		ulint i = 0;

		for(auto c : S){

			result[i++] = mod_int_t(c) * coefficient;
			coefficient = coefficient * sigma;

		}

		return result;

	}